

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::SpreadVolatileSemantics::SpreadVolatileSemanticsToVariables
          (SpreadVolatileSemantics *this,bool is_vk_memory_model_enabled)

{
  bool bVar1;
  uint32_t var_id;
  undefined1 local_80 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  entry_function_ids;
  Instruction *var;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  Status status;
  bool is_vk_memory_model_enabled_local;
  SpreadVolatileSemantics *this_local;
  
  __range2._0_4_ = SuccessWithoutChange;
  Pass::context(&this->super_Pass);
  IRContext::types_values((IRContext *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&var);
  while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&var), bVar1) {
    entry_function_ids._M_h._M_single_bucket =
         (__node_base_ptr)
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    var_id = opt::Instruction::result_id((Instruction *)entry_function_ids._M_h._M_single_bucket);
    EntryFunctionsToSpreadVolatileSemanticsForVar
              ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_80,this,var_id);
    bVar1 = diligent_spirv_cross::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::empty((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_80);
    if (!bVar1) {
      if (is_vk_memory_model_enabled) {
        SetVolatileForLoadsInEntries
                  (this,(Instruction *)entry_function_ids._M_h._M_single_bucket,
                   (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_80);
      }
      else {
        DecorateVarWithVolatile(this,(Instruction *)entry_function_ids._M_h._M_single_bucket);
      }
      __range2._0_4_ = SuccessWithChange;
    }
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_80);
    InstructionList::iterator::operator++(&__end2);
  }
  return (Status)__range2;
}

Assistant:

Pass::Status SpreadVolatileSemantics::SpreadVolatileSemanticsToVariables(
    const bool is_vk_memory_model_enabled) {
  Status status = Status::SuccessWithoutChange;
  for (Instruction& var : context()->types_values()) {
    auto entry_function_ids =
        EntryFunctionsToSpreadVolatileSemanticsForVar(var.result_id());
    if (entry_function_ids.empty()) {
      continue;
    }

    if (is_vk_memory_model_enabled) {
      SetVolatileForLoadsInEntries(&var, entry_function_ids);
    } else {
      DecorateVarWithVolatile(&var);
    }
    status = Status::SuccessWithChange;
  }
  return status;
}